

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobatto_polynomial.cpp
# Opt level: O3

void lobatto_polynomial_plot(int ndx_num,int *ndx,string *prefix)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  void *pvVar4;
  void *pvVar5;
  double *pdVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  undefined4 in_register_0000003c;
  int iVar12;
  long lVar13;
  int iVar14;
  void *pvVar15;
  void *pvVar16;
  int iVar17;
  bool bVar18;
  long local_4e8;
  ofstream data_unit;
  ios_base local_3f0 [264];
  long local_2e8;
  ofstream command_unit;
  ios_base local_1f0 [264];
  size_type *local_e8;
  string plot_filename;
  size_type *local_b0;
  string data_filename;
  string command_filename;
  size_type *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  __str.field_2._8_8_ = CONCAT44(in_register_0000003c,ndx_num);
  data_filename.field_2._8_8_ = &command_filename._M_string_length;
  command_filename._M_dataplus._M_p = (pointer)0x0;
  command_filename._M_string_length._0_1_ = 0;
  std::ofstream::ofstream(&local_2e8);
  local_b0 = &data_filename._M_string_length;
  data_filename._M_dataplus._M_p = (pointer)0x0;
  data_filename._M_string_length._0_1_ = 0;
  std::ofstream::ofstream(&local_4e8);
  local_e8 = &plot_filename._M_string_length;
  plot_filename._M_dataplus._M_p = (pointer)0x0;
  plot_filename._M_string_length._0_1_ = 0;
  command_filename.field_2._8_8_ = r8vec_linspace_new(0x1f5,-1.0,1.0);
  uVar9 = 0xffffffffffffffff;
  if (-1 < (int)__str.field_2._8_8_) {
    uVar9 = (long)((int)__str.field_2._8_8_ * 0x1f5) << 3;
  }
  pvVar4 = operator_new__(uVar9);
  pvVar5 = operator_new__(uVar9);
  plot_filename.field_2._8_8_ = __str.field_2._8_8_ & 0xffffffff;
  if (0 < (int)__str.field_2._8_8_) {
    lVar10 = 0;
    pvVar15 = pvVar5;
    pvVar16 = pvVar4;
    do {
      iVar12 = ndx[lVar10];
      pdVar6 = lobatto_polynomial_value(0x1f5,iVar12,(double *)command_filename.field_2._8_8_);
      lVar13 = (long)(iVar12 * 0x1f5 + -0x1f5);
      lVar8 = 0;
      do {
        *(double *)((long)pvVar16 + lVar8 * 8) = pdVar6[lVar13 + lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x1f5);
      operator_delete__(pdVar6);
      pdVar6 = lobatto_polynomial_derivative(0x1f5,iVar12,(double *)command_filename.field_2._8_8_);
      lVar8 = 0;
      do {
        *(double *)((long)pvVar15 + lVar8 * 8) = pdVar6[lVar13 + lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x1f5);
      operator_delete__(pdVar6);
      lVar10 = lVar10 + 1;
      pvVar16 = (void *)((long)pvVar16 + 0xfa8);
      pvVar15 = (void *)((long)pvVar15 + 0xfa8);
    } while (lVar10 != plot_filename.field_2._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_58 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_58);
  if (local_58 != &__str._M_string_length) {
    operator_delete(local_58,__str._M_string_length + 1);
  }
  std::ofstream::open((char *)&local_4e8,(_Ios_Openmode)local_b0);
  lVar8 = plot_filename.field_2._8_8_ * 0xfa8;
  lVar10 = 0;
  pvVar15 = pvVar4;
  do {
    std::ostream::_M_insert<double>(*(double *)(command_filename.field_2._8_8_ + lVar10 * 8));
    if (0 < (int)__str.field_2._8_4_) {
      lVar13 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4e8,"  ",2);
        std::ostream::_M_insert<double>(*(double *)((long)pvVar15 + lVar13));
        lVar13 = lVar13 + 0xfa8;
      } while (lVar8 - lVar13 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4e8,"\n",1);
    lVar10 = lVar10 + 1;
    pvVar15 = (void *)((long)pvVar15 + 8);
  } while (lVar10 != 0x1f5);
  std::ofstream::close();
  psVar1 = &__str._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Lobatto value data in \'",0x19);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_b0,(long)data_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_58 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::operator=
            ((string *)(data_filename.field_2._M_local_buf + 8),(string *)&local_58);
  if (local_58 != psVar1) {
    operator_delete(local_58,__str._M_string_length + 1);
  }
  std::ofstream::open((char *)&local_2e8,(_Ios_Openmode)data_filename.field_2._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"# ",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_2e8,(char *)data_filename.field_2._8_8_,
                      (long)command_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"#\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"# Usage:\n",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"#  gnuplot < ",0xd);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_2e8,(char *)data_filename.field_2._8_8_,
                      (long)command_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"#\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"unset key\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"set term png\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"set timestamp\n",0xe);
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_58 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_58);
  if (local_58 != psVar1) {
    operator_delete(local_58,__str._M_string_length + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"set output \'",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_2e8,(char *)local_e8,(long)plot_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"set xlabel \'x\'\n",0xf)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2e8,"set ylabel \'L(n,x)\'\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2e8,"set title \'Lobatto values\'\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"set grid\n",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2e8,"set style data lines\n",0x15);
  if (0 < (int)__str.field_2._8_4_) {
    iVar12 = __str.field_2._8_4_ + -1;
    iVar17 = 0;
    iVar14 = 0;
    do {
      bVar18 = iVar17 == 0;
      iVar17 = iVar17 + -1;
      pcVar11 = "     \'";
      if (bVar18) {
        pcVar11 = "plot \'";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,pcVar11,6);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_2e8,(char *)local_b0,
                          (long)data_filename._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' using 1:",10);
      std::ostream::operator<<(poVar7,iVar14 + 2);
      if (iVar14 < iVar12) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,", \\",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"\n",1);
      iVar14 = iVar14 + 1;
    } while (iVar14 != __str.field_2._8_4_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"quit\n",5);
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Lobatto value commands in \'",0x1d);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)data_filename.field_2._8_8_,
                      (long)command_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_58 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_58);
  if (local_58 != &__str._M_string_length) {
    operator_delete(local_58,__str._M_string_length + 1);
  }
  std::ofstream::open((char *)&local_4e8,(_Ios_Openmode)local_b0);
  lVar8 = plot_filename.field_2._8_8_ * 0xfa8;
  lVar10 = 0;
  pvVar15 = pvVar5;
  do {
    std::ostream::_M_insert<double>(*(double *)(command_filename.field_2._8_8_ + lVar10 * 8));
    if (0 < (int)__str.field_2._8_4_) {
      lVar13 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4e8,"  ",2);
        std::ostream::_M_insert<double>(*(double *)((long)pvVar15 + lVar13));
        lVar13 = lVar13 + 0xfa8;
      } while (lVar8 - lVar13 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4e8,"\n",1);
    lVar10 = lVar10 + 1;
    pvVar15 = (void *)((long)pvVar15 + 8);
  } while (lVar10 != 0x1f5);
  std::ofstream::close();
  psVar1 = &__str._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Lobatto derivative data stored in \'",0x25);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_b0,(long)data_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_58 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::operator=
            ((string *)(data_filename.field_2._M_local_buf + 8),(string *)&local_58);
  if (local_58 != psVar1) {
    operator_delete(local_58,__str._M_string_length + 1);
  }
  std::ofstream::open((char *)&local_2e8,(_Ios_Openmode)data_filename.field_2._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"# ",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_2e8,(char *)data_filename.field_2._8_8_,
                      (long)command_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"#\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"# Usage:\n",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"#  gnuplot < ",0xd);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_2e8,(char *)data_filename.field_2._8_8_,
                      (long)command_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"#\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"unset key\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"set term png\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"set timestamp\n",0xe);
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_58 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_58);
  if (local_58 != psVar1) {
    operator_delete(local_58,__str._M_string_length + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"set output \'",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_2e8,(char *)local_e8,(long)plot_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"set xlabel \'x\'\n",0xf)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2e8,"set ylabel \'L(n,x)\'\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2e8,"set title \'Lobatto derivatives\'\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"set grid\n",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2e8,"set style data lines\n",0x15);
  if (0 < (int)__str.field_2._8_4_) {
    iVar12 = __str.field_2._8_4_ + -1;
    iVar17 = 0;
    iVar14 = 0;
    do {
      bVar18 = iVar17 == 0;
      iVar17 = iVar17 + -1;
      pcVar11 = "     \'";
      if (bVar18) {
        pcVar11 = "plot \'";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,pcVar11,6);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_2e8,(char *)local_b0,
                          (long)data_filename._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' using 1:",10);
      std::ostream::operator<<(poVar7,iVar14 + 2);
      if (iVar14 < iVar12) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,", \\",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"\n",1);
      iVar14 = iVar14 + 1;
    } while (iVar14 != __str.field_2._8_4_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2e8,"quit\n",5);
  uVar3 = command_filename.field_2._8_8_;
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Lobatto derivative commands in \'",0x22);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)data_filename.field_2._8_8_,
                      (long)command_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
  if (uVar3 != 0) {
    operator_delete__((void *)uVar3);
  }
  operator_delete__(pvVar4);
  operator_delete__(pvVar5);
  if (local_e8 != &plot_filename._M_string_length) {
    operator_delete(local_e8,CONCAT71(plot_filename._M_string_length._1_7_,
                                      (undefined1)plot_filename._M_string_length) + 1);
  }
  uVar3 = _log;
  lVar10 = _VTT;
  local_4e8 = _VTT;
  *(undefined8 *)((long)&local_4e8 + *(long *)(_VTT + -0x18)) = _log;
  std::filebuf::~filebuf((filebuf *)&data_unit);
  std::ios_base::~ios_base(local_3f0);
  if (local_b0 != &data_filename._M_string_length) {
    operator_delete(local_b0,CONCAT71(data_filename._M_string_length._1_7_,
                                      (undefined1)data_filename._M_string_length) + 1);
  }
  local_2e8 = lVar10;
  *(undefined8 *)((long)&local_2e8 + *(long *)(lVar10 + -0x18)) = uVar3;
  std::filebuf::~filebuf((filebuf *)&command_unit);
  std::ios_base::~ios_base(local_1f0);
  if ((size_type *)data_filename.field_2._8_8_ != &command_filename._M_string_length) {
    operator_delete((void *)data_filename.field_2._8_8_,
                    CONCAT71(command_filename._M_string_length._1_7_,
                             (undefined1)command_filename._M_string_length) + 1);
  }
  return;
}

Assistant:

void lobatto_polynomial_plot ( int ndx_num, int ndx[], std::string prefix )

//****************************************************************************80
//
//  Purpose:
//
//    LOBATTO_POLYNOMIAL_PLOT plots one or more completed Lobatto polynomials.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 November 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int NDX_NUM, the number of polynomials to plot.
//
//    Input, int NDX[NDX_NUM], the orders of 1 or more
//    Legendre polynomials to be plotted together.
//
//    Input, string PREFIX. the filename prefix.
//
{
  std::string command_filename;
  std::ofstream command_unit;
  std::string data_filename;
  std::ofstream data_unit;
  int i;
  int j;
  double *l;
  double *lp;
  int n;
  std::string plot_filename;
  double *x;
  double x_hi;
  double x_lo;
  static int x_num = 501;
  double *y;
  double *yp;

  x_lo = -1.0;
  x_hi = +1.0;
  x = r8vec_linspace_new ( x_num, x_lo, x_hi );
//
//  Collect the data.
//
  y = new double[x_num*ndx_num];
  yp = new double[x_num*ndx_num];

  for ( j = 0; j < ndx_num; j++ )
  {
    n = ndx[j];

    l = lobatto_polynomial_value ( x_num, n, x );
    for ( i = 0; i < x_num; i++ )
    {
      y[i+j*x_num] = l[i+(n-1)*x_num];
    }
    delete [] l;

    lp = lobatto_polynomial_derivative ( x_num, n, x );
    for ( i = 0; i < x_num; i++ )
    {
      yp[i+j*x_num] = lp[i+(n-1)*x_num];
    }
    delete [] lp;
  }

  std::cout << "\n";
//
//  Make data file for values.
//
  data_filename = prefix + "_value_data.txt";

  data_unit.open ( data_filename.c_str ( ) );

  for ( i = 0; i < x_num; i++ )
  {
    data_unit << x[i];
    for ( j = 0; j < ndx_num; j++ )
    {
      data_unit << "  " << y[i+j*x_num];
    }
    data_unit << "\n";
  }
  data_unit.close ( );

  std::cout << "  Lobatto value data in '" << data_filename << "'\n";
//
//  Make command file for values.
//
  command_filename = prefix + "_value_commands.txt";

  command_unit.open ( command_filename.c_str ( ) );

  command_unit << "# " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "# Usage:\n";
  command_unit << "#  gnuplot < " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "unset key\n";
  command_unit << "set term png\n";
  command_unit << "set timestamp\n";

  plot_filename = prefix + "_value.png";

  command_unit << "set output '" << plot_filename << "'\n";
  command_unit << "set xlabel 'x'\n";
  command_unit << "set ylabel 'L(n,x)'\n";
  command_unit << "set title 'Lobatto values'\n";
  command_unit << "set grid\n";
  command_unit << "set style data lines\n";
  for ( j = 0; j < ndx_num; j++ )
  {
    if ( j == 0 )
    {
      command_unit << "plot '";
    }
    else
    {
      command_unit << "     '";
    }
    command_unit << data_filename << "' using 1:" << j + 2;
    if ( j < ndx_num - 1 )
    {
      command_unit << ", \\";
    }
    command_unit << "\n";
  }
  command_unit << "quit\n";

  command_unit.close ( );

  std::cout << "  Lobatto value commands in '" << command_filename << "'\n";
//
//  Make data file for derivatives.
//
  data_filename = prefix + "_derivative_data.txt";

  data_unit.open ( data_filename.c_str ( ) );

  for ( i = 0; i < x_num; i++ )
  {
    data_unit << x[i];
    for ( j = 0; j < ndx_num; j++ )
    {
      data_unit << "  " << yp[i+j*x_num];
    }
    data_unit << "\n";
  }
  data_unit.close ( );

   std::cout << "  Lobatto derivative data stored in '" << data_filename << "'\n";
//
//  Make command file for derivatives.
//
  command_filename = prefix + "_derivative_commands.txt";

  command_unit.open ( command_filename.c_str ( ) );

  command_unit << "# " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "# Usage:\n";
  command_unit << "#  gnuplot < " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "unset key\n";
  command_unit << "set term png\n";
  command_unit << "set timestamp\n";

  plot_filename = prefix + "_derivative.png";

  command_unit << "set output '" << plot_filename << "'\n";
  command_unit << "set xlabel 'x'\n";
  command_unit << "set ylabel 'L(n,x)'\n";
  command_unit << "set title 'Lobatto derivatives'\n";
  command_unit << "set grid\n";
  command_unit << "set style data lines\n";
  for ( j = 0; j < ndx_num; j++ )
  {
    if ( j == 0 )
    {
      command_unit << "plot '";
    }
    else
    {
      command_unit << "     '";
    }
    command_unit << data_filename << "' using 1:" << j + 2;
    if ( j < ndx_num - 1 )
    {
      command_unit << ", \\";
    }
    command_unit << "\n";
  }
  command_unit << "quit\n";

  command_unit.close ( );

  std::cout << "  Lobatto derivative commands in '" << command_filename << "'\n";

  delete [] x;
  delete [] y;
  delete [] yp;

  return;
}